

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::visitMemoryFill(OptimizeInstructions *this,MemoryFill *curr)

{
  Expression *rep;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression.type.id != 1) {
    if (((((this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
          .currModule)->features).features & 0x10) == 0) {
      __assert_fail("getModule()->features.hasBulkMemory()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x504,"void wasm::OptimizeInstructions::visitMemoryFill(MemoryFill *)");
    }
    rep = optimizeMemoryFill(this,curr);
    if (rep != (Expression *)0x0) {
      replaceCurrent(this,rep);
      return;
    }
  }
  return;
}

Assistant:

void visitMemoryFill(MemoryFill* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    assert(getModule()->features.hasBulkMemory());
    if (auto* ret = optimizeMemoryFill(curr)) {
      return replaceCurrent(ret);
    }
  }